

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall kj::String::String(String *this,Array<char> *buffer)

{
  Array<char> *other;
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  Array<char> *buffer_local;
  String *this_local;
  
  other = mv<kj::Array<char>>(buffer);
  Array<char>::Array(&this->content,other);
  sVar1 = Array<char>::size(&this->content);
  bVar3 = false;
  if (sVar1 != 0) {
    pcVar2 = Array<char>::back(&this->content);
    bVar3 = *pcVar2 == '\0';
  }
  if (!bVar3) {
    kj::_::inlineRequireFailure
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.h"
               ,800,"content.size() > 0 && content.back() == \'\\0\'",
               "\"String must be NUL-terminated.\"","String must be NUL-terminated.");
  }
  return;
}

Assistant:

inline String::String(Array<char> buffer): content(kj::mv(buffer)) {
  KJ_IREQUIRE(content.size() > 0 && content.back() == '\0', "String must be NUL-terminated.");
}